

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O0

void __thiscall leveldb::anon_unknown_1::PosixEnv::BackgroundThreadMain(PosixEnv *this)

{
  _func_void_void_ptr *p_Var1;
  void *pvVar2;
  bool bVar3;
  reference pvVar4;
  void *background_work_arg;
  _func_void_void_ptr *background_work_function;
  PosixEnv *this_local;
  
  while( true ) {
    port::Mutex::Lock(&this->background_work_mutex_);
    while( true ) {
      bVar3 = std::
              queue<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::deque<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>_>
              ::empty(&this->background_work_queue_);
      if (!bVar3) break;
      port::CondVar::Wait(&this->background_work_cv_);
    }
    bVar3 = std::
            queue<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::deque<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>_>
            ::empty(&this->background_work_queue_);
    if (((bVar3 ^ 0xffU) & 1) == 0) break;
    pvVar4 = std::
             queue<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::deque<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>_>
             ::front(&this->background_work_queue_);
    p_Var1 = pvVar4->function;
    pvVar4 = std::
             queue<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::deque<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>_>
             ::front(&this->background_work_queue_);
    pvVar2 = pvVar4->arg;
    std::
    queue<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::deque<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>_>
    ::pop(&this->background_work_queue_);
    port::Mutex::Unlock(&this->background_work_mutex_);
    (*p_Var1)(pvVar2);
  }
  __assert_fail("!background_work_queue_.empty()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/util/env_posix.cc"
                ,0x32b,"void leveldb::(anonymous namespace)::PosixEnv::BackgroundThreadMain()");
}

Assistant:

void PosixEnv::BackgroundThreadMain() {
  while (true) {
    background_work_mutex_.Lock();

    // Wait until there is work to be done.
    while (background_work_queue_.empty()) {
      background_work_cv_.Wait();
    }

    assert(!background_work_queue_.empty());
    auto background_work_function = background_work_queue_.front().function;
    void* background_work_arg = background_work_queue_.front().arg;
    background_work_queue_.pop();

    background_work_mutex_.Unlock();
    background_work_function(background_work_arg);
  }
}